

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64_shift.hpp
# Opt level: O1

void __thiscall trng::lcg64_shift::split(lcg64_shift *this,uint s,uint n)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  byte bVar4;
  uint i;
  result_type rVar5;
  long lVar6;
  result_type rVar7;
  result_type rVar8;
  ulong uVar9;
  long lVar10;
  result_type rVar11;
  long lVar12;
  ulong uVar13;
  result_type rVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  invalid_argument local_40 [16];
  
  if (s <= n) {
    std::invalid_argument::invalid_argument
              (local_40,"invalid argument for trng::lcg64_shift::split");
    utility::throw_this<std::invalid_argument>(local_40);
    std::invalid_argument::~invalid_argument(local_40);
  }
  if (1 < s) {
    uVar2 = (ulong)n + 1;
    rVar8 = (this->P).b;
    if (n < 0xf) {
      rVar5 = (this->S).r;
      do {
        rVar5 = rVar5 * (this->P).a + rVar8;
        uVar1 = (int)uVar2 - 1;
        uVar2 = (ulong)uVar1;
      } while (uVar1 != 0);
      (this->S).r = rVar5;
    }
    else {
      rVar5 = (this->P).a;
      rVar14 = (this->S).r;
      bVar4 = 0;
      do {
        if ((uVar2 & 1) != 0) {
          uVar13 = 1L << (bVar4 & 0x3f);
          lVar3 = 1;
          rVar11 = rVar5;
          uVar9 = uVar13;
          do {
            rVar7 = rVar11;
            if ((uVar9 & 1) == 0) {
              rVar7 = 1;
            }
            lVar3 = lVar3 * rVar7;
            rVar11 = rVar11 * rVar11;
            bVar17 = 1 < uVar9;
            uVar9 = uVar9 >> 1;
          } while (bVar17);
          uVar9 = uVar13 >> 1;
          if (uVar9 == 0) {
            uVar16 = 0x40;
          }
          else {
            uVar16 = 0x3f;
            if (uVar9 != 0) {
              for (; uVar9 >> uVar16 == 0; uVar16 = uVar16 - 1) {
              }
            }
            uVar16 = uVar16 ^ 0x3f;
          }
          uVar9 = 0;
          lVar6 = 0;
          rVar11 = rVar5;
          do {
            if ((uVar13 >> (uVar9 & 0x3f) & 1) != 0) {
              lVar10 = 1;
              rVar7 = rVar5;
              for (uVar15 = uVar9; uVar15 != 0; uVar15 = uVar15 - 1) {
                lVar10 = lVar10 * (rVar7 + 1);
                rVar7 = rVar7 * rVar7;
              }
              lVar6 = lVar6 * rVar11 + lVar10;
            }
            rVar11 = rVar11 * rVar11;
            uVar9 = uVar9 + 1;
          } while (uVar9 != 0x41 - uVar16);
          rVar14 = lVar6 * rVar8 + lVar3 * rVar14;
          (this->S).r = rVar14;
        }
        bVar4 = bVar4 + 1;
        bVar17 = 1 < uVar2;
        uVar2 = uVar2 >> 1;
      } while (bVar17);
    }
    uVar1 = s >> 1;
    if (uVar1 == 0) {
      uVar2 = 0x40;
    }
    else {
      uVar2 = 0x3f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar2 = uVar2 ^ 0x3f;
    }
    rVar8 = (this->P).a;
    lVar6 = 0;
    lVar3 = 0;
    rVar5 = rVar8;
    do {
      if (((uint)(1L << ((byte)lVar6 & 0x3f)) & s) != 0) {
        lVar10 = 1;
        rVar14 = rVar8;
        for (lVar12 = lVar6; lVar12 != 0; lVar12 = lVar12 + -1) {
          lVar10 = lVar10 * (rVar14 + 1);
          rVar14 = rVar14 * rVar14;
        }
        lVar3 = lVar3 * rVar5 + lVar10;
      }
      rVar5 = rVar5 * rVar5;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x41 - uVar2);
    rVar5 = lVar3 * (this->P).b;
    (this->P).b = rVar5;
    rVar14 = 1;
    uVar2 = (ulong)s;
    do {
      rVar11 = rVar8;
      if ((uVar2 & 1) == 0) {
        rVar11 = 1;
      }
      rVar14 = rVar14 * rVar11;
      rVar8 = rVar8 * rVar8;
      bVar17 = 1 < uVar2;
      uVar2 = uVar2 >> 1;
    } while (bVar17);
    (this->P).a = rVar14;
    rVar8 = (this->S).r;
    lVar3 = 0;
    do {
      uVar9 = 1L << ((byte)lVar3 & 0x3f);
      lVar6 = 1;
      rVar11 = rVar14;
      uVar2 = uVar9;
      do {
        rVar7 = rVar11;
        if ((uVar2 & 1) == 0) {
          rVar7 = 1;
        }
        lVar6 = lVar6 * rVar7;
        rVar11 = rVar11 * rVar11;
        bVar17 = 1 < uVar2;
        uVar2 = uVar2 >> 1;
      } while (bVar17);
      uVar2 = uVar9 >> 1;
      if (uVar2 == 0) {
        uVar13 = 0x40;
      }
      else {
        uVar13 = 0x3f;
        if (uVar2 != 0) {
          for (; uVar2 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        uVar13 = uVar13 ^ 0x3f;
      }
      uVar2 = 0;
      lVar10 = 0;
      rVar11 = rVar14;
      do {
        if ((uVar9 >> (uVar2 & 0x3f) & 1) != 0) {
          lVar12 = 1;
          rVar7 = rVar14;
          for (uVar16 = uVar2; uVar16 != 0; uVar16 = uVar16 - 1) {
            lVar12 = lVar12 * (rVar7 + 1);
            rVar7 = rVar7 * rVar7;
          }
          lVar10 = lVar10 * rVar11 + lVar12;
        }
        rVar11 = rVar11 * rVar11;
        uVar2 = uVar2 + 1;
      } while (uVar2 != 0x41 - uVar13);
      rVar8 = lVar10 * rVar5 + rVar8 * lVar6;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    (this->S).r = rVar8;
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void lcg64_shift::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(
          std::invalid_argument("invalid argument for trng::lcg64_shift::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      P.b *= f(s, P.a);
      P.a = pow(P.a, s);
      backward();
    }
  }